

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_Array.h
# Opt level: O2

void __thiscall
axl::sl::
ArrayRef<axl::sl::AuxList<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>,_axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>_>_>
::release(ArrayRef<axl::sl::AuxList<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>,_axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>_>_>
          *this)

{
  if (this->m_hdr != (Hdr *)0x0) {
    rc::RefCount::release((RefCount *)this->m_hdr);
  }
  this->m_p = (AuxList<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>
               *)0x0;
  this->m_hdr = (Hdr *)0x0;
  this->m_count = 0;
  return;
}

Assistant:

void
	release() {
		if (m_hdr)
			m_hdr->release();

		initialize();
	}